

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_rank_function.cpp
# Opt level: O2

void __thiscall
duckdb::WindowPeerLocalState::NextRank
          (WindowPeerLocalState *this,idx_t partition_begin,idx_t peer_begin,idx_t row_idx)

{
  uint64_t uVar1;
  
  if (partition_begin == row_idx) {
    uVar1 = 1;
    this->dense_rank = 1;
    this->rank = 1;
  }
  else if (peer_begin == row_idx) {
    this->dense_rank = this->dense_rank + 1;
    this->rank = this->rank + this->rank_equal;
    uVar1 = 1;
  }
  else {
    uVar1 = this->rank_equal + 1;
  }
  this->rank_equal = uVar1;
  return;
}

Assistant:

void WindowPeerLocalState::NextRank(idx_t partition_begin, idx_t peer_begin, idx_t row_idx) {
	if (partition_begin == row_idx) {
		dense_rank = 1;
		rank = 1;
		rank_equal = 0;
	} else if (peer_begin == row_idx) {
		dense_rank++;
		rank += rank_equal;
		rank_equal = 0;
	}
	rank_equal++;
}